

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O3

UWORD32 ihevcd_bits_nxt32(bitstrm_t *ps_bitstrm,UWORD32 u4_numbits)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0x20 - ps_bitstrm->u4_bit_ofst;
  uVar2 = 0;
  if (uVar1 < 0x20) {
    uVar2 = ps_bitstrm->u4_nxt_word >> ((byte)uVar1 & 0x1f);
  }
  return ps_bitstrm->u4_cur_word << ((byte)ps_bitstrm->u4_bit_ofst & 0x1f) | uVar2;
}

Assistant:

UWORD32 ihevcd_bits_nxt32(bitstrm_t *ps_bitstrm, UWORD32 u4_numbits)
{
    UWORD32 u4_bits_read;
    UNUSED(u4_numbits);
    BITS_NXT32(u4_bits_read,
               ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word);
    return u4_bits_read;
}